

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::CompilerGLSL::attempt_emit_loop_header
          (CompilerGLSL *this,SPIRBlock *block,Method method)

{
  uint32_t uVar1;
  bool bVar2;
  ContinueBlockType CVar3;
  SPIRBlock *pSVar4;
  iterator iVar5;
  CompilerGLSL *pCVar6;
  SPIRBlock *pSVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  BlockID to;
  string initializer;
  string continue_block;
  string condition;
  string local_50;
  
  pSVar4 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                     (&this->super_Compiler,(block->continue_block).id);
  CVar3 = Compiler::continue_block_type(&this->super_Compiler,pSVar4);
  if ((method & ~MergeToSelectContinueForLoop) == MergeToSelectForLoop) {
    uVar1 = this->statement_count;
    emit_block_instructions_with_masked_debug(this,block);
    initializer._M_dataplus._M_p._0_4_ = (block->condition).id;
    iVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->super_Compiler).forced_temporaries._M_h,(key_type_conflict *)&initializer
                  );
    bVar2 = Compiler::flush_phi_required
                      (&this->super_Compiler,(BlockID)(block->super_IVariant).self.id,
                       (BlockID)(block->true_block).id);
    if ((((!bVar2) &&
         (bVar2 = Compiler::flush_phi_required
                            (&this->super_Compiler,(BlockID)(block->super_IVariant).self.id,
                             (BlockID)(block->false_block).id),
         iVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) &&
        (!bVar2)) && (uVar1 == this->statement_count)) {
      if (CVar3 == WhileLoop) {
        flush_undeclared_variables(this,block);
        emit_while_loop_initializers(this,block);
        (*(this->super_Compiler)._vptr_Compiler[0x39])(this,block);
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_(&initializer,this,(block->condition).id,true);
        pCVar6 = (CompilerGLSL *)
                 Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(block->true_block).id);
        pSVar4 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(block->merge_block).id);
        bVar2 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar6,pSVar4);
        if (bVar2) {
          enclose_expression(&continue_block,pCVar6,&initializer);
          join<char_const(&)[2],std::__cxx11::string>
                    (&condition,(diligent_spirv_cross *)0x7c44e2,(char (*) [2])&continue_block,
                     pbVar8);
          ::std::__cxx11::string::operator=((string *)&initializer,(string *)&condition);
          ::std::__cxx11::string::~string((string *)&condition);
          ::std::__cxx11::string::~string((string *)&continue_block);
        }
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [8])"while (",&initializer,(char (*) [2])0x801c00);
      }
      else {
        if (CVar3 != ForLoop) goto LAB_00653c4e;
        flush_undeclared_variables(this,block);
        emit_for_loop_initializers_abi_cxx11_(&initializer,this,block);
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_(&condition,this,(block->condition).id,true);
        pCVar6 = (CompilerGLSL *)
                 Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(block->true_block).id);
        pSVar4 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(block->merge_block).id);
        bVar2 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar6,pSVar4);
        if (bVar2) {
          enclose_expression(&local_50,pCVar6,&condition);
          join<char_const(&)[2],std::__cxx11::string>
                    (&continue_block,(diligent_spirv_cross *)0x7c44e2,(char (*) [2])&local_50,pbVar8
                    );
          ::std::__cxx11::string::operator=((string *)&condition,(string *)&continue_block);
          ::std::__cxx11::string::~string((string *)&continue_block);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        (*(this->super_Compiler)._vptr_Compiler[0x39])(this,block);
        if (method == MergeToSelectContinueForLoop) {
          statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
                    (this,(char (*) [6])"for (",&initializer,(char (*) [3])"; ",&condition,
                     (char (*) [4])"; )");
        }
        else {
          emit_continue_block_abi_cxx11_
                    (&continue_block,this,(block->continue_block).id,false,false);
          statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                    (this,(char (*) [6])"for (",&initializer,(char (*) [3])"; ",&condition,
                     (char (*) [3])"; ",&continue_block,(char (*) [2])0x801c00);
          ::std::__cxx11::string::~string((string *)&continue_block);
        }
        ::std::__cxx11::string::~string((string *)&condition);
      }
      ::std::__cxx11::string::~string((string *)&initializer);
      begin_scope(this);
      return true;
    }
  }
  else {
    if (method != MergeToDirectForLoop) {
      return false;
    }
    pSVar4 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                       (&this->super_Compiler,(block->next_block).id);
    flush_undeclared_variables(this,pSVar4);
    uVar1 = this->statement_count;
    emit_block_instructions_with_masked_debug(this,pSVar4);
    initializer._M_dataplus._M_p._0_4_ = (pSVar4->condition).id;
    iVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->super_Compiler).forced_temporaries._M_h,(key_type_conflict *)&initializer
                  );
    bVar2 = Compiler::flush_phi_required
                      (&this->super_Compiler,(BlockID)(pSVar4->super_IVariant).self.id,
                       (BlockID)(pSVar4->true_block).id);
    if (((!bVar2) &&
        (bVar2 = Compiler::flush_phi_required
                           (&this->super_Compiler,(BlockID)(pSVar4->super_IVariant).self.id,
                            (BlockID)(pSVar4->false_block).id),
        iVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)) &&
       ((!bVar2 && (uVar1 == this->statement_count)))) {
      to.id = (pSVar4->true_block).id;
      if (CVar3 == WhileLoop) {
        emit_while_loop_initializers(this,block);
        (*(this->super_Compiler)._vptr_Compiler[0x39])(this,block);
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_(&initializer,this,(pSVar4->condition).id,true);
        pCVar6 = (CompilerGLSL *)
                 Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(pSVar4->true_block).id);
        pSVar7 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(block->merge_block).id);
        bVar2 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar6,pSVar7);
        if (bVar2) {
          enclose_expression(&continue_block,pCVar6,&initializer);
          join<char_const(&)[2],std::__cxx11::string>
                    (&condition,(diligent_spirv_cross *)0x7c44e2,(char (*) [2])&continue_block,
                     pbVar8);
          ::std::__cxx11::string::operator=((string *)&initializer,(string *)&condition);
          ::std::__cxx11::string::~string((string *)&condition);
          ::std::__cxx11::string::~string((string *)&continue_block);
          to.id = (pSVar4->false_block).id;
        }
        statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [8])"while (",&initializer,(char (*) [2])0x801c00);
      }
      else {
        if (CVar3 != ForLoop) goto LAB_00653c4e;
        emit_for_loop_initializers_abi_cxx11_(&initializer,this,block);
        pbVar8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        to_expression_abi_cxx11_(&condition,this,(pSVar4->condition).id,true);
        pCVar6 = (CompilerGLSL *)
                 Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(pSVar4->true_block).id);
        pSVar7 = Compiler::get<diligent_spirv_cross::SPIRBlock>
                           (&this->super_Compiler,(block->merge_block).id);
        bVar2 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar6,pSVar7);
        if (bVar2) {
          enclose_expression(&local_50,pCVar6,&condition);
          join<char_const(&)[2],std::__cxx11::string>
                    (&continue_block,(diligent_spirv_cross *)0x7c44e2,(char (*) [2])&local_50,pbVar8
                    );
          ::std::__cxx11::string::operator=((string *)&condition,(string *)&continue_block);
          ::std::__cxx11::string::~string((string *)&continue_block);
          ::std::__cxx11::string::~string((string *)&local_50);
          to.id = (pSVar4->false_block).id;
        }
        emit_continue_block_abi_cxx11_(&continue_block,this,(block->continue_block).id,false,false);
        (*(this->super_Compiler)._vptr_Compiler[0x39])(this,block);
        statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [6])"for (",&initializer,(char (*) [3])"; ",&condition,
                   (char (*) [3])"; ",&continue_block,(char (*) [2])0x801c00);
        ::std::__cxx11::string::~string((string *)&continue_block);
        ::std::__cxx11::string::~string((string *)&condition);
      }
      ::std::__cxx11::string::~string((string *)&initializer);
      begin_scope(this);
      branch(this,(BlockID)(pSVar4->super_IVariant).self.id,to);
      return true;
    }
  }
LAB_00653c4e:
  block->disable_block_optimization = true;
  Compiler::force_recompile(&this->super_Compiler);
  begin_scope(this);
  return false;
}

Assistant:

bool CompilerGLSL::attempt_emit_loop_header(SPIRBlock &block, SPIRBlock::Method method)
{
	SPIRBlock::ContinueBlockType continue_type = continue_block_type(get<SPIRBlock>(block.continue_block));

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		uint32_t current_count = statement_count;
		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(block);

		bool condition_is_temporary = forced_temporaries.find(block.condition) == end(forced_temporaries);

		bool flushes_phi = flush_phi_required(block.self, block.true_block) ||
		                   flush_phi_required(block.self, block.false_block);

		// This can work! We only did trivial things which could be forwarded in block body!
		if (!flushes_phi && current_count == statement_count && condition_is_temporary)
		{
			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
				flush_undeclared_variables(block);

				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(block.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				emit_block_hints(block);
				if (method != SPIRBlock::MergeToSelectContinueForLoop)
				{
					auto continue_block = emit_continue_block(block.continue_block, false, false);
					statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				}
				else
					statement("for (", initializer, "; ", condition, "; )");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the while loop header.
				flush_undeclared_variables(block);
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(block.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		auto &child = get<SPIRBlock>(block.next_block);

		// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
		flush_undeclared_variables(child);

		uint32_t current_count = statement_count;

		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(child);

		bool condition_is_temporary = forced_temporaries.find(child.condition) == end(forced_temporaries);

		bool flushes_phi = flush_phi_required(child.self, child.true_block) ||
		                   flush_phi_required(child.self, child.false_block);

		if (!flushes_phi && current_count == statement_count && condition_is_temporary)
		{
			uint32_t target_block = child.true_block;

			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(child.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				auto continue_block = emit_continue_block(block.continue_block, false, false);
				emit_block_hints(block);
				statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(child.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			branch(child.self, target_block);
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else
		return false;
}